

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1Update(SHA1_CTX *context,uchar *data,uint32_t len)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  uint32_t j;
  uint32_t i;
  uchar *in_stack_00000028;
  uint32_t *in_stack_00000030;
  undefined4 local_1c;
  undefined4 local_18;
  
  uVar1 = *(uint *)(in_RDI + 0x14);
  uVar2 = in_EDX * 8 + *(int *)(in_RDI + 0x14);
  *(uint *)(in_RDI + 0x14) = uVar2;
  if (uVar2 < uVar1) {
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  }
  *(uint *)(in_RDI + 0x18) = (in_EDX >> 0x1d) + *(int *)(in_RDI + 0x18);
  local_1c = uVar1 >> 3 & 0x3f;
  if (local_1c + in_EDX < 0x40) {
    local_18 = 0;
  }
  else {
    local_18 = 0x40 - local_1c;
    memcpy((void *)(in_RDI + 0x1c + (ulong)local_1c),in_RSI,(ulong)local_18);
    SHA1Transform(in_stack_00000030,in_stack_00000028);
    for (; local_18 + 0x3f < in_EDX; local_18 = local_18 + 0x40) {
      SHA1Transform(in_stack_00000030,in_stack_00000028);
    }
    local_1c = 0;
  }
  memcpy((void *)(in_RDI + 0x1c + (ulong)local_1c),(void *)((long)in_RSI + (ulong)local_18),
         (ulong)(in_EDX - local_18));
  return;
}

Assistant:

void SHA1Update(
    SHA1_CTX * context,
    const unsigned char *data,
    uint32_t len
)
{
    uint32_t i;

    uint32_t j;

    j = context->count[0];
    if ((context->count[0] += len << 3) < j)
        context->count[1]++;
    context->count[1] += (len >> 29);
    j = (j >> 3) & 63;
    if ((j + len) > 63)
    {
        memcpy(&context->buffer[j], data, (i = 64 - j));
        SHA1Transform(context->state, context->buffer);
        for (; i + 63 < len; i += 64)
        {
            SHA1Transform(context->state, &data[i]);
        }
        j = 0;
    }
    else
        i = 0;
    memcpy(&context->buffer[j], &data[i], len - i);
}